

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.h
# Opt level: O0

void __thiscall
disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
~Sequencer(Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *this)

{
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *unaff_retaddr;
  
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector(unaff_retaddr)
  ;
  RingBuffer<long,_0>::~RingBuffer((RingBuffer<long,_0> *)0x164079);
  return;
}

Assistant:

Sequencer(size_t n) : ring_buffer_(n), claim_strategy_(n) {}